

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O1

bool Rml::ElementUtilities::GetClippingRegion
               (Element *element,Rectanglei *out_clip_region,
               ClipMaskGeometryList *out_clip_mask_list,bool force_clip_self)

{
  pointer *ppCVar1;
  uint uVar2;
  iterator __position;
  Vector2f VVar3;
  ClipMaskGeometryList *this;
  ComputedValues *pCVar4;
  Element *this_00;
  TransformState *this_01;
  Matrix4f *pMVar5;
  ElementBackgroundBorder *this_02;
  Vector2Type VVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  Vector2Type VVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  undefined7 uVar12;
  char cVar13;
  uint uVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  Rectanglef element_region;
  BoxArea local_104;
  Rectangle<float> local_100;
  uint local_ec;
  undefined8 local_e8;
  ulong local_d0;
  undefined1 local_c8 [8];
  undefined4 uStack_c0;
  float fStack_bc;
  ClipMaskGeometryList *local_b0;
  Vector2f local_a8;
  Rectanglei *local_98;
  Element *local_90;
  undefined1 local_88 [24];
  Matrix4f *pMStack_70;
  undefined1 local_58 [16];
  float local_48;
  
  uVar7 = CONCAT71(in_register_00000009,force_clip_self) & 0xffffffff;
  uVar11 = uVar7 ^ 1;
  local_b0 = out_clip_mask_list;
  pCVar4 = Element::GetComputedValues(element);
  bVar10 = (pCVar4->rare).clip.value;
  bVar9 = 0;
  if ((bVar10 == 0xff & (byte)uVar11) == 0) {
    bVar9 = 0;
    if ('\0' < (char)bVar10) {
      bVar9 = bVar10;
    }
    this_00 = element;
    local_98 = out_clip_region;
    if ((char)uVar7 == '\0') {
      this_00 = Element::GetOffsetParent(element);
    }
    uVar14 = (uint)bVar9;
    local_100._0_12_ = ZEXT412(0xbf800000) << 0x40;
    local_100.p1.y = -1.0;
    local_ec = (uint)CONCAT71(in_register_00000009,force_clip_self);
    local_90 = element;
    do {
      if (this_00 == (Element *)0x0) break;
      uVar12 = (undefined7)(uVar11 >> 8);
      bVar10 = this_00 == local_90 & (byte)uVar7;
      uVar11 = CONCAT71(uVar12,bVar10);
      pCVar4 = Element::GetComputedValues(this_00);
      uVar7 = *(ulong *)&pCVar4->common;
      uVar2 = *(uint *)&(pCVar4->rare).clip;
      cVar13 = (char)uVar2;
      if (cVar13 < '\x01') {
        uVar2 = 0;
      }
      if (cVar13 == -2) {
        if ((uVar14 != 0 & (bVar10 ^ 1)) == 0) {
LAB_00234b1d:
          local_104 = Border;
          local_d0 = uVar7;
          if (bVar10 == 0) {
            local_104 = Element::GetClipArea(this_00);
          }
          if (bVar10 == 0 && cVar13 != -2) {
            fVar16 = Element::GetClientWidth(this_00);
            local_e8 = (Matrix4f *)CONCAT44(local_e8._4_4_,fVar16);
            fVar16 = Element::GetScrollWidth(this_00);
            if ((float)local_e8 < fVar16 + -0.5) goto LAB_00234b70;
            fVar16 = Element::GetClientHeight(this_00);
            local_e8 = (Matrix4f *)CONCAT44(local_e8._4_4_,fVar16);
            fVar16 = Element::GetScrollHeight(this_00);
            uVar11 = CONCAT71(uVar12,fVar16 + -0.5 <= (float)local_e8);
          }
          else {
LAB_00234b70:
            uVar11 = 0;
          }
          if (local_b0 == (ClipMaskGeometryList *)0x0) {
            bVar15 = false;
          }
          else {
            this_01 = Element::GetTransformState(this_00);
            if (this_01 == (TransformState *)0x0) {
              pMVar5 = (Matrix4f *)0x0;
            }
            else {
              pMVar5 = TransformState::GetTransform(this_01);
            }
            if (((((~(byte)uVar11 & pMVar5 != (Matrix4f *)0x0) != 0) ||
                 (0 < (pCVar4->rare).border_top_left_radius)) ||
                (0 < (pCVar4->rare).border_top_right_radius)) ||
               ((0 < (pCVar4->rare).border_bottom_right_radius ||
                (0 < (pCVar4->rare).border_bottom_left_radius)))) {
              local_c8._0_4_ = (int)uVar11;
              local_e8 = pMVar5;
              this_02 = Element::GetElementBackgroundBorder(this_00);
              local_a8 = (Vector2f)
                         ElementBackgroundBorder::GetClipGeometry(this_02,this_00,local_104);
              this = local_b0;
              fVar16 = (float)((uint)((local_b0->
                                      super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                                      )._M_impl.super__Vector_impl_data._M_start !=
                                     (local_b0->
                                     super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                                     )._M_impl.super__Vector_impl_data._M_finish) * 2);
              VVar3 = Element::GetAbsoluteOffset(this_00,Border);
              local_58._8_4_ = extraout_XMM0_Dc;
              local_58._0_4_ = VVar3.x;
              local_58._4_4_ = VVar3.y;
              local_58._12_4_ = extraout_XMM0_Dd;
              local_48 = Math::Round(VVar3.x);
              fVar17 = Math::Round((float)local_58._4_4_);
              local_88._8_4_ = local_a8.x;
              local_88._12_4_ = local_a8.y;
              local_88._20_4_ = fVar17;
              local_88._16_4_ = local_48;
              pMStack_70 = local_e8;
              __position._M_current =
                   (this->
                   super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_88._0_4_ = fVar16;
              if (__position._M_current ==
                  (this->
                  super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>)
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::
                _M_realloc_insert<Rml::ClipMaskGeometry>
                          (this,__position,(ClipMaskGeometry *)local_88);
              }
              else {
                (__position._M_current)->absolute_offset = (Vector2f)local_88._16_8_;
                (__position._M_current)->transform = local_e8;
                *(ulong *)__position._M_current = CONCAT44(local_88._4_4_,fVar16);
                (__position._M_current)->geometry = (Geometry *)local_a8;
                ppCVar1 = &(this->
                           super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppCVar1 = *ppCVar1 + 1;
              }
              uVar11 = (ulong)(uint)local_c8._0_4_;
              pMVar5 = local_e8;
            }
            bVar15 = pMVar5 != (Matrix4f *)0x0;
          }
          bVar10 = (byte)uVar11 | bVar15;
          uVar11 = CONCAT71((int7)(uVar11 >> 8),bVar10);
          uVar7 = local_d0;
          if (bVar10 == 0) {
            uVar11 = (ulong)local_104;
            VVar3 = Element::GetAbsoluteOffset(this_00,local_104);
            uStack_c0 = extraout_XMM0_Dc_00;
            local_c8._0_4_ = VVar3.x;
            local_c8._4_4_ = VVar3.y;
            fStack_bc = (float)extraout_XMM0_Dd_00;
            fVar16 = Math::Round(VVar3.x);
            local_e8 = (Matrix4f *)CONCAT44(extraout_XMM0_Db,fVar16);
            local_a8.x = Math::Round((float)local_c8._4_4_);
            local_a8.y = extraout_XMM0_Db_00;
            local_c8._4_4_ = local_a8.x;
            local_c8._0_4_ = (float)local_e8;
            uStack_c0 = local_e8._4_4_;
            fStack_bc = extraout_XMM0_Db_00;
            Element::GetRenderBox((RenderBox *)local_88,this_00,local_104,0);
            local_88._8_4_ = (float)local_e8 + (float)local_88._0_4_;
            local_88._12_4_ = (float)local_88._4_4_ + local_a8.x;
            local_88._0_4_ = local_c8._0_4_;
            local_88._4_4_ = local_c8._4_4_;
            local_100 = Rectangle<float>::IntersectIfValid((Rectangle<float> *)local_88,local_100);
            uVar7 = local_d0;
          }
        }
      }
      else if ((uVar7 & 0x3c00) != 0 && uVar14 == 0 || bVar10 != 0) goto LAB_00234b1d;
      uVar14 = uVar14 - (uVar14 != 0 && (uVar7 & 0x3c00) != 0);
      if ((int)uVar14 <= (int)(uVar2 & 0xff)) {
        uVar14 = uVar2 & 0xff;
      }
      if (cVar13 != -1) {
        this_00 = Element::GetOffsetParent(this_00);
      }
      uVar7 = (ulong)local_ec;
    } while (cVar13 != -1);
    if (local_100.p0.x <= local_100.p1.x) {
      if (local_100.p0.y <= local_100.p1.y) {
        Math::SnapToPixelGrid(&local_100);
        VVar6.x = (int)local_100.p0.x;
        VVar8.x = (int)local_100.p1.x;
        VVar6.y = (int)local_100.p0.y;
        VVar8.y = (int)local_100.p1.y;
        local_98->p0 = VVar6;
        local_98->p1 = VVar8;
      }
    }
    bVar9 = -(local_100.p0.y <= local_100.p1.y) & -(local_100.p0.x <= local_100.p1.x);
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool ElementUtilities::GetClippingRegion(Element* element, Rectanglei& out_clip_region, ClipMaskGeometryList* out_clip_mask_list,
	bool force_clip_self)
{
	using Style::Clip;
	Clip target_element_clip = element->GetComputedValues().clip();
	if (target_element_clip == Clip::Type::None && !force_clip_self)
		return false;

	int num_ignored_clips = target_element_clip.GetNumber();

	// Search through the element's ancestors, finding all elements that clip their overflow and have overflow to clip.
	// For each that we find, we combine their clipping region with the existing clipping region, and so build up a
	// complete clipping region for the element.
	Element* clipping_element = (force_clip_self ? element : element->GetOffsetParent());

	Rectanglef clip_region = Rectanglef::MakeInvalid();

	while (clipping_element)
	{
		const bool force_clip_current_element = (force_clip_self && clipping_element == element);
		const ComputedValues& clip_computed = clipping_element->GetComputedValues();
		const bool clip_enabled = (clip_computed.overflow_x() != Style::Overflow::Visible || clip_computed.overflow_y() != Style::Overflow::Visible);
		const bool clip_always = (clip_computed.clip() == Clip::Type::Always);
		const bool clip_none = (clip_computed.clip() == Clip::Type::None);
		const int clip_number = clip_computed.clip().GetNumber();

		// Merge the existing clip region with the current clip region, unless we are ignoring clip regions.
		if (((clip_always || clip_enabled) && num_ignored_clips == 0) || force_clip_current_element)
		{
			const BoxArea clip_area = (force_clip_current_element ? BoxArea::Border : clipping_element->GetClipArea());
			const bool has_clipping_content =
				(clip_always || force_clip_current_element || clipping_element->GetClientWidth() < clipping_element->GetScrollWidth() - 0.5f ||
					clipping_element->GetClientHeight() < clipping_element->GetScrollHeight() - 0.5f);
			bool disable_scissor_clipping = false;

			if (out_clip_mask_list)
			{
				const TransformState* transform_state = clipping_element->GetTransformState();
				const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);
				const bool has_border_radius = (clip_computed.border_top_left_radius() > 0.f || clip_computed.border_top_right_radius() > 0.f ||
					clip_computed.border_bottom_right_radius() > 0.f || clip_computed.border_bottom_left_radius() > 0.f);

				// If the element has border-radius we always use a clip mask, since we can't easily predict if content is located on the curved
				// region to be clipped. If the element has a transform we only use a clip mask when the content clips.
				if (has_border_radius || (transform && has_clipping_content))
				{
					Geometry* clip_geometry = clipping_element->GetElementBackgroundBorder()->GetClipGeometry(clipping_element, clip_area);
					const ClipMaskOperation clip_operation = (out_clip_mask_list->empty() ? ClipMaskOperation::Set : ClipMaskOperation::Intersect);
					const Vector2f absolute_offset = clipping_element->GetAbsoluteOffset(BoxArea::Border).Round();
					out_clip_mask_list->push_back(ClipMaskGeometry{clip_operation, clip_geometry, absolute_offset, transform});
				}

				// If we only have border-radius then we add this element to the scissor region as well as the clip mask. This may help with e.g.
				// culling text render calls. However, when we have a transform, the element cannot be added to the scissor region since its geometry
				// may be projected entirely elsewhere.
				if (transform)
					disable_scissor_clipping = true;
			}

			if (has_clipping_content && !disable_scissor_clipping)
			{
				// Shrink the scissor region to the element's client area.
				Vector2f element_offset = clipping_element->GetAbsoluteOffset(clip_area).Round();
				Vector2f element_size = clipping_element->GetRenderBox(clip_area).GetFillSize();
				Rectanglef element_region = Rectanglef::FromPositionSize(element_offset, element_size);

				clip_region = element_region.IntersectIfValid(clip_region);
			}
		}

		// If this region is meant to clip and we're skipping regions, update the counter.
		if (num_ignored_clips > 0 && clip_enabled)
			num_ignored_clips--;

		// Inherit how many clip regions this ancestor ignores.
		num_ignored_clips = Math::Max(num_ignored_clips, clip_number);

		// If this region ignores all clipping regions, then we do too.
		if (clip_none)
			break;

		// Climb the tree to this region's parent.
		clipping_element = clipping_element->GetOffsetParent();
	}

	if (clip_region.Valid())
	{
		Math::SnapToPixelGrid(clip_region);
		out_clip_region = Rectanglei(clip_region);
	}

	return clip_region.Valid();
}